

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_array.hpp
# Opt level: O0

void __thiscall
test::CustomArray<std::vector<int,_std::allocator<int>_>,_10UL>::CustomArray
          (CustomArray<std::vector<int,_std::allocator<int>_>,_10UL> *this,
          initializer_list<std::vector<int,_std::allocator<int>_>_> il)

{
  size_type sVar1;
  runtime_error *this_00;
  const_iterator __first;
  vector<int,_std::allocator<int>_> *in_RDI;
  initializer_list<std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff90;
  initializer_list<std::vector<int,_std::allocator<int>_>_> *this_01;
  vector<int,_std::allocator<int>_> *local_30;
  initializer_list<std::vector<int,_std::allocator<int>_>_> local_10;
  
  local_30 = in_RDI;
  do {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x186880);
    local_30 = local_30 + 1;
  } while (local_30 != in_RDI + 10);
  sVar1 = std::initializer_list<std::vector<int,_std::allocator<int>_>_>::size(&local_10);
  if (sVar1 != 10) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"init list size does not match array size");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_01 = &local_10;
  __first = std::initializer_list<std::vector<int,_std::allocator<int>_>_>::begin(this_01);
  std::initializer_list<std::vector<int,_std::allocator<int>_>_>::end(in_stack_ffffffffffffff90);
  std::begin<std::vector<int,std::allocator<int>>,10ul>
            ((vector<int,_std::allocator<int>_> (*) [10])in_RDI);
  std::copy<std::vector<int,std::allocator<int>>const*,std::vector<int,std::allocator<int>>*>
            (__first,(vector<int,_std::allocator<int>_> *)this_01,
             (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90);
  return;
}

Assistant:

CustomArray(std::initializer_list<T> il)
  {
    if (il.size() != N) { throw std::runtime_error("init list size does not match array size"); }
    std::copy(il.begin(), il.end(), std::begin(array));
  }